

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

Ptr __thiscall core::image::load_pfm_file(image *this,string *filename)

{
  int iVar1;
  float fVar2;
  image *piVar3;
  istream *this_00;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  FileException *this_01;
  int *piVar7;
  char *msg;
  Exception *pEVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int y;
  ulong uVar12;
  ulong uVar13;
  Ptr PVar14;
  long local_278;
  ifstream in;
  int aiStack_258 [122];
  string local_70;
  int local_4c;
  image *piStack_48;
  int width;
  Ptr *image;
  char temp;
  char local_35;
  int height;
  char signature [2];
  float scale;
  
  piStack_48 = this;
  std::ifstream::ifstream(&local_278,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_258 + *(long *)(local_278 + -0x18)) != 0) {
    this_01 = (FileException *)__cxa_allocate_exception(0x48);
    piVar7 = __errno_location();
    msg = strerror(*piVar7);
    util::FileException::FileException(this_01,filename,msg);
    __cxa_throw(this_01,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::istream::read((char *)&local_278,(long)&temp);
  if (local_35 == 'f' && temp == 'P') {
    iVar1 = 1;
  }
  else {
    if ((temp != 'P') || (local_35 != 'F')) {
      std::ifstream::close();
      pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_70,"PPM signature did not match",(allocator *)&local_4c);
      util::Exception::Exception(pEVar8,&local_70);
      __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    iVar1 = 3;
  }
  local_4c = 0;
  image._4_4_ = 0;
  height = -0x40800000;
  this_00 = (istream *)std::istream::operator>>((istream *)&local_278,&local_4c);
  pfVar4 = (float *)std::istream::operator>>(this_00,(int *)((long)&image + 4));
  std::istream::_M_extract<float>(pfVar4);
  std::istream::read((char *)&local_278,(long)&image + 2);
  if (0x10000000 < image._4_4_ * local_4c) {
    std::ifstream::close();
    pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_70,"Image too friggin huge",(allocator *)((long)&image + 3));
    util::Exception::Exception(pEVar8,&local_70);
    __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  Image<float>::create((Image<float> *)piStack_48,local_4c,image._4_4_,iVar1);
  piVar3 = piStack_48;
  uVar5 = (**(code **)(**(long **)piStack_48 + 0x18))();
  lVar6 = *(long *)piVar3;
  iVar1 = *(int *)(lVar6 + 0xc);
  uVar12 = 0;
  lVar9 = *(long *)(lVar6 + 0x20) - *(ulong *)(lVar6 + 0x18);
  uVar13 = *(ulong *)(lVar6 + 0x18);
  if (lVar9 == 0) {
    uVar13 = uVar12;
  }
  uVar13 = uVar13 + lVar9;
  if (lVar9 == 0) {
    uVar13 = uVar12;
  }
  for (; (int)uVar12 < image._4_4_; uVar12 = (ulong)((int)uVar12 + 1)) {
    uVar13 = uVar13 - uVar5 / (ulong)(long)iVar1;
    std::istream::read((char *)&local_278,uVar13);
  }
  std::ifstream::close();
  pfVar4 = *(float **)(*(long *)piStack_48 + 0x18);
  lVar6 = *(long *)(*(long *)piStack_48 + 0x20);
  lVar9 = lVar6 - (long)pfVar4;
  pfVar10 = pfVar4;
  if (lVar9 == 0) {
    pfVar10 = (float *)0x0;
  }
  pfVar11 = (float *)((long)pfVar10 + lVar9);
  if (lVar9 == 0) {
    pfVar11 = (float *)0x0;
  }
  if (0.0 <= (float)height) {
    for (; pfVar10 != pfVar11; pfVar10 = pfVar10 + 1) {
      fVar2 = *pfVar10;
      *pfVar10 = (float)((uint)fVar2 >> 0x18 | ((uint)fVar2 & 0xff0000) >> 8 |
                         ((uint)fVar2 & 0xff00) << 8 | (int)fVar2 << 0x18);
    }
  }
  else {
    height = height ^ 0x80000000;
  }
  if (((float)height != 1.0) || (NAN((float)height))) {
    lVar6 = lVar6 - (long)pfVar4;
    if (lVar6 == 0) {
      pfVar4 = (float *)0x0;
    }
    pfVar10 = (float *)((long)pfVar4 + lVar6);
    if (lVar6 == 0) {
      pfVar10 = (float *)0x0;
    }
    std::for_each<float*,math::algo::foreach_multiply_with_const<float>>
              (pfVar4,pfVar10,(foreach_multiply_with_const<float>)height);
  }
  std::ifstream::~ifstream(&local_278);
  PVar14.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar14.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piStack_48;
  return (Ptr)PVar14.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FloatImage::Ptr
load_pfm_file (std::string const& filename)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));

    char signature[2];
    in.read(signature, 2);

    // check signature and determine channels
    int channels = 0;
    if (signature[0] == 'P' && signature[1] == 'f')
        channels = 1;
    else if (signature[0] == 'P' && signature[1] == 'F')
        channels = 3;
    else
    {
        in.close();
        throw util::Exception("PPM signature did not match");
    }

    /* Read width and height as well as max value. */
    int width = 0;
    int height = 0;
    float scale = -1.0;
    in >> width >> height >> scale;

    /* Read final whitespace character. */
    char temp;
    in.read(&temp, 1);

    /* Check image width and height. Shouldn't be too large. */
    if (width * height > PPM_MAX_PIXEL_AMOUNT)
    {
        in.close();
        throw util::Exception("Image too friggin huge");
    }

    /* Read image rows in reverse order according to PFM specification. */
    FloatImage::Ptr image = FloatImage::create(width, height, channels);
    std::size_t row_size = image->get_byte_size() / image->height();
    char* ptr = reinterpret_cast<char*>(image->end()) - row_size;
    for (int y = 0; y < height; ++y, ptr -= row_size)
        in.read(ptr, row_size);
    in.close();

    /* Handle endianess. BE if scale > 0, LE if scale < 0. */
    if (scale < 0.0f)
    {
        std::transform(image->begin(), image->end(), image->begin(),
            (float(*)(float const&))util::system::letoh<float>);
        scale = -scale;
    }
    else
    {
        std::transform(image->begin(), image->end(), image->begin(),
            (float(*)(float const&))util::system::betoh<float>);
    }

    /* Handle scale. Multiply image values if scale is not 1.0. */
    if (scale != 1.0f)
    {
        std::for_each(image->begin(), image->end(),
            math::algo::foreach_multiply_with_const<float>(scale));
    }

   return image;
}